

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comments.cpp
# Opt level: O0

void __thiscall
Comments_CommentCanContainHorizontalTab_Test::~Comments_CommentCanContainHorizontalTab_Test
          (Comments_CommentCanContainHorizontalTab_Test *this)

{
  Comments_CommentCanContainHorizontalTab_Test *this_local;
  
  ~Comments_CommentCanContainHorizontalTab_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Comments, CommentCanContainHorizontalTab) {
    std::istringstream input("# this comment has a tab \t <-- here it is");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::comment, " this comment has a tab \t <-- here it is"},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}